

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_create.c
# Opt level: O1

mpt_metatype * mpt_iterator_create(char *conf)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  ushort **ppuVar5;
  mpt_metatype *pmVar6;
  int *piVar7;
  char *in_RDI;
  ulong uVar8;
  bool bVar9;
  mpt_value val;
  char buf [32];
  char *local_60;
  mpt_value local_58;
  char local_48 [40];
  
  local_58._addr = (char **)0x0;
  local_58._type = 0;
  local_60 = in_RDI;
  if (in_RDI != (char *)0x0) {
    cVar2 = *in_RDI;
    bVar9 = (long)cVar2 == 0;
    if (!bVar9) {
      ppuVar5 = __ctype_b_loc();
      bVar3 = *(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1);
      while ((bVar3 & 0x20) != 0) {
        local_60 = in_RDI + 1;
        cVar2 = *local_60;
        bVar9 = (long)cVar2 == 0;
        if (bVar9) goto LAB_00108ce1;
        in_RDI = local_60;
        bVar3 = *(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1);
      }
      if (!bVar9) {
        ppuVar5 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1) & 3) == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = 0;
          do {
            pcVar1 = in_RDI + uVar8;
            uVar8 = uVar8 + 1;
          } while ((*(byte *)((long)*ppuVar5 + (long)*pcVar1 * 2 + 1) & 3) != 0);
        }
        if (uVar8 < 0x20) {
          if (uVar8 == 0) {
            pmVar6 = mpt_iterator_values(in_RDI);
            return pmVar6;
          }
          memcpy(local_48,in_RDI,uVar8 - 1);
          local_48[uVar8 - 1] = '\0';
          local_60 = in_RDI + (uVar8 - 1);
          local_58._addr = &local_60;
          local_58._type = 0x73;
          iVar4 = strcasecmp(local_48,"linear");
          if ((iVar4 == 0) || (iVar4 = strcasecmp(local_48,"lin"), iVar4 == 0)) {
            pmVar6 = _mpt_iterator_linear(&local_58);
            return pmVar6;
          }
          iVar4 = strcasecmp(local_48,"factor");
          if (((iVar4 == 0) || (iVar4 = strcasecmp(local_48,"fact"), iVar4 == 0)) ||
             (iVar4 = strcasecmp(local_48,"fac"), iVar4 == 0)) {
            pmVar6 = _mpt_iterator_factor(&local_58);
            return pmVar6;
          }
          iVar4 = strcasecmp(local_48,"range");
          if (iVar4 == 0) {
            pmVar6 = _mpt_iterator_range(&local_58);
            return pmVar6;
          }
        }
        piVar7 = __errno_location();
        *piVar7 = 0x16;
        return (mpt_metatype *)0x0;
      }
    }
  }
LAB_00108ce1:
  pmVar6 = _mpt_iterator_range((mpt_value *)0x0);
  return pmVar6;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_iterator_create(const char *conf)
{
	MPT_STRUCT(value) val = MPT_VALUE_INIT(0, 0);
	size_t len;
	char buf[32];
	char curr;
	
	if (!conf) {
		return _mpt_iterator_range(0);
	}
	/* consume whitespace */
	while (*conf && isspace(*conf)) {
		conf++;
	}
	if (!(curr = *conf)) {
		return _mpt_iterator_range(0);
	}
	/* extract description string */
	len = 0;
	while ((isupper(curr) || islower(curr))) {
		curr = conf[len++];
	}
	if (len >= sizeof(buf)) {
		errno = EINVAL;
		return 0;
	}
	/* no description -> use normal values */
	if (!len--) {
		return mpt_iterator_values(conf);
	}
	
	memcpy(buf, conf, len);
	buf[len] = 0;
	
	conf += len;
	MPT_value_set(&val, 's', &conf);
	
	/* create matching iterators */
	if (!strcasecmp(buf, "linear")
	 || !strcasecmp(buf, "lin")) {
		return _mpt_iterator_linear(&val);
	}
	if (!strcasecmp(buf, "factor")
	 || !strcasecmp(buf, "fact")
	 || !strcasecmp(buf, "fac")) {
		return _mpt_iterator_factor(&val);
	}
	if (!strcasecmp(buf, "range")) {
		return _mpt_iterator_range(&val);
	}
	/* unknown value iterator type */
	errno = EINVAL;
	return 0;
}